

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void string32_suite::test_one(void)

{
  undefined4 local_80;
  value local_7c [5];
  type local_68;
  undefined4 local_44;
  value local_40 [2];
  undefined1 local_38 [8];
  decoder decoder;
  value_type input [6];
  
  decoder.current.view._M_str._4_2_ = 0x4100;
  decoder.current.view._M_str._0_4_ = 0x1c9;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[6]>
            ((decoder *)local_38,(uchar (*) [6])&decoder.current.view._M_str);
  local_40[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_44 = 0xc9;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::string32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x49b,"void string32_suite::test_one()",local_40,&local_44);
  trial::protocol::bintoken::detail::decoder::value<trial::protocol::bintoken::token::string>
            (&local_68,(decoder *)local_38);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[2]>
            ("decoder.value<token::string>()","\"A\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x49c,"void string32_suite::test_one()",&local_68,"A");
  std::__cxx11::string::~string((string *)&local_68);
  trial::protocol::bintoken::detail::decoder::next((decoder *)local_38);
  local_7c[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_80 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x49e,"void string32_suite::test_one()",local_7c,&local_80);
  return;
}

Assistant:

void test_one()
{
    const value_type input[] = { token::code::string32, 0x01, 0x00, 0x00, 0x00, 0x41 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::string32);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::string>(), "A");
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}